

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O1

MPP_RET mpp_packet_copy_init(MppPacket *packet,MppPacket src)

{
  size_t __n;
  MPP_RET MVar1;
  void *in_RAX;
  void *__dest;
  MppPacket pkt;
  void *local_28;
  
  if ((packet == (MppPacket *)0x0) ||
     (local_28 = in_RAX, MVar1 = check_is_mpp_packet_f(src,"mpp_packet_copy_init"), MVar1 != MPP_OK)
     ) {
    _mpp_log_l(2,"mpp_packet","found invalid input %p %p\n","mpp_packet_copy_init",packet,src);
    return MPP_ERR_UNKNOW;
  }
  *packet = (MppPacket)0x0;
  MVar1 = mpp_packet_new(&local_28);
  if (MVar1 != MPP_OK) {
    return MVar1;
  }
  memcpy(local_28,src,0x148);
  if (*(MppMeta *)((long)src + 0x48) != (MppMeta)0x0) {
    mpp_meta_inc_ref(*(MppMeta *)((long)src + 0x48));
  }
  if (*(MppBuffer *)((long)src + 0x40) == (MppBuffer)0x0) {
    check_is_mpp_packet_f(src,"mpp_packet_get_length");
    __n = *(size_t *)((long)src + 0x20);
    __dest = mpp_osal_malloc("mpp_packet_copy_init",__n + 0x100);
    if (__dest == (void *)0x0) {
      _mpp_log_l(2,"mpp_packet","malloc failed, size %d\n","mpp_packet_copy_init",__n);
      mpp_packet_deinit(&local_28);
    }
    else {
      *(void **)((long)local_28 + 0x10) = __dest;
      *(void **)((long)local_28 + 8) = __dest;
      *(size_t *)((long)local_28 + 0x20) = __n;
      *(size_t *)((long)local_28 + 0x18) = __n;
      *(byte *)((long)local_28 + 0x3c) = *(byte *)((long)local_28 + 0x3c) | 4;
      if (__n != 0) {
        memcpy(__dest,*(void **)((long)src + 0x10),__n);
        memset((void *)(__n + (long)__dest),0,0x100);
      }
    }
    if (__dest == (void *)0x0) {
      return MPP_ERR_MALLOC;
    }
  }
  else {
    mpp_buffer_inc_ref_with_caller(*(MppBuffer *)((long)src + 0x40),"mpp_packet_copy_init");
  }
  *packet = local_28;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_packet_copy_init(MppPacket *packet, const MppPacket src)
{
    if (NULL == packet || check_is_mpp_packet(src)) {
        mpp_err_f("found invalid input %p %p\n", packet, src);
        return MPP_ERR_UNKNOW;
    }

    *packet = NULL;

    MppPacketImpl *src_impl = (MppPacketImpl *)src;
    MppPacket pkt;
    MPP_RET ret = mpp_packet_new(&pkt);
    if (ret)
        return ret;

    /* copy the source data */
    memcpy(pkt, src_impl, sizeof(*src_impl));

    /* increase reference of meta data */
    if (src_impl->meta)
        mpp_meta_inc_ref(src_impl->meta);

    if (src_impl->buffer) {
        /* if source packet has buffer just create a new reference to buffer */
        mpp_buffer_inc_ref(src_impl->buffer);
    } else {
        /*
         * NOTE: only copy valid data
         */
        size_t length = mpp_packet_get_length(src);
        /*
         * due to parser may be read 32 bit interface so we must alloc more size
         * then real size to avoid read carsh
         */
        void *pos = mpp_malloc_size(void, length + 256);
        if (NULL == pos) {
            mpp_err_f("malloc failed, size %d\n", length);
            mpp_packet_deinit(&pkt);
            return MPP_ERR_MALLOC;
        }

        MppPacketImpl *p = (MppPacketImpl *)pkt;
        p->data = p->pos = pos;
        p->size = p->length = length;
        p->flag |= MPP_PACKET_FLAG_INTERNAL;

        if (length) {
            memcpy(pos, src_impl->pos, length);
            /*
             * clean more alloc byte to zero
             */
            memset((RK_U8*)pos + length, 0, 256);
        }
    }

    *packet = pkt;
    return MPP_OK;
}